

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_freezemetal(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *pOVar3;
  CHAR_DATA *in_RCX;
  int piercedam;
  int crushdam;
  int highchance;
  int iWear;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  undefined1 in_stack_00001312;
  undefined1 in_stack_00001313;
  int in_stack_00001314;
  int in_stack_00001318;
  int in_stack_0000131c;
  CHAR_DATA *in_stack_00001320;
  CHAR_DATA *in_stack_00001328;
  int in_stack_00001348;
  int in_stack_00001350;
  char *in_stack_00001358;
  int in_stack_000024d0;
  int in_stack_000024d4;
  void *in_stack_000024d8;
  void *in_stack_000024e0;
  CHAR_DATA *in_stack_000024e8;
  char *in_stack_000024f0;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  int iVar4;
  int iVar5;
  int local_38;
  int local_34;
  
  act(in_stack_ffffffffffffffb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
      (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  act(in_stack_ffffffffffffffb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
      (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  act(in_stack_ffffffffffffffb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
      (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  iVar5 = 0;
  iVar4 = 0;
  for (local_34 = 0; local_34 < 0x16; local_34 = local_34 + 1) {
    pOVar3 = get_eq_char(in_RCX,local_34);
    if ((((pOVar3 != (OBJ_DATA *)0x0) && (local_34 != 0x10)) && (local_34 != 0x12)) &&
       (bVar1 = is_obj_stat((OBJ_DATA *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa4), !bVar1)) {
      if (pOVar3->pIndexData->material_index < 1) {
        local_38 = 0;
      }
      else {
        local_38 = material_table[pOVar3->pIndexData->material_index].mat_conductivity * 0x14;
      }
      iVar2 = number_range(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      if (iVar2 < local_38) {
        act_new(in_stack_000024f0,in_stack_000024e8,in_stack_000024e0,in_stack_000024d8,
                in_stack_000024d4,in_stack_000024d0);
        act(in_stack_ffffffffffffffb0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
            (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
            (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        act(in_stack_ffffffffffffffb0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
            (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
            (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        iVar2 = dice(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        iVar5 = iVar2 + iVar5;
        if (pOVar3->pIndexData->material_index < 1) {
          local_38 = 0;
        }
        else {
          local_38 = (int)material_table[pOVar3->pIndexData->material_index].mat_conductivity << 2;
        }
        iVar2 = number_range(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        if (iVar2 < local_38) {
          act_new(in_stack_000024f0,in_stack_000024e8,in_stack_000024e0,in_stack_000024d8,
                  in_stack_000024d4,in_stack_000024d0);
          act(in_stack_ffffffffffffffb0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
              (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
          act(in_stack_ffffffffffffffb0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
              (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
          iVar2 = dice(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          iVar4 = iVar2 + iVar4;
          extract_obj((OBJ_DATA *)CONCAT44(iVar5,iVar4));
        }
      }
    }
  }
  if (0 < iVar5) {
    damage_new(in_stack_00001328,in_stack_00001320,in_stack_0000131c,in_stack_00001318,
               in_stack_00001314,(bool)in_stack_00001313,(bool)in_stack_00001312,in_stack_00001348,
               in_stack_00001350,in_stack_00001358);
  }
  if (0 < iVar4) {
    damage_new(in_stack_00001328,in_stack_00001320,in_stack_0000131c,in_stack_00001318,
               in_stack_00001314,(bool)in_stack_00001313,(bool)in_stack_00001312,in_stack_00001348,
               in_stack_00001350,in_stack_00001358);
  }
  return;
}

Assistant:

void spell_freezemetal(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	int iWear, highchance, crushdam, piercedam;

	act("The air around you suddenly turns ice cold.", ch, 0, victim, TO_VICT);
	act("You attempt to siphon heat away from $N's armor.", ch, 0, victim, TO_CHAR);
	act("$n extends a hand toward $N, as a chill fills the air.", ch, 0, victim, TO_NOTVICT);

	crushdam = 0;
	piercedam = 0;

	for (iWear = 0; iWear < MAX_WEAR; iWear++)
	{
		obj = get_eq_char(victim, iWear);

		if (obj == nullptr || iWear == WEAR_WIELD || iWear == WEAR_DUAL_WIELD)
			continue;

		if (is_obj_stat(obj, ITEM_BURN_PROOF))
			continue;

		if (obj->pIndexData->material_index > 0)
			highchance = material_table[obj->pIndexData->material_index].mat_conductivity * 20;
		else
			highchance = 0;

		if (number_range(0, 100) >= highchance)
			continue;

		act_new("Your $p contracts due to the cold, crushing you painfully!", ch, obj, victim, TO_VICT, POS_DEAD);
		act("$N's $p contracts, crushing him painfully!", ch, obj, victim, TO_CHAR);
		act("$N's $p contracts, crushing him painfully!", ch, obj, victim, TO_NOTVICT);

		crushdam += dice(level / 10, 7);

		if (obj->pIndexData->material_index > 0)
			highchance = material_table[obj->pIndexData->material_index].mat_conductivity * 4;
		else
			highchance = 0;

		if (number_range(0, 100) >= highchance)
			continue;

		act_new("Your $p shatters violently, piercing you with countless shards!", ch, obj, victim, TO_VICT, POS_DEAD);
		act("$N's $p shatters violently due to the cold!", ch, obj, victim, TO_CHAR);
		act("$N's $p shatters violently due to the cold!", ch, obj, victim, TO_NOTVICT);
		piercedam += dice(level / 5, 9);

		extract_obj(obj);
	}

	if (crushdam > 0)
		damage_new(ch, victim, crushdam, sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the contracting armor*");

	if (piercedam > 0)
		damage_new(ch, victim, piercedam, sn, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the metal shards*$");
}